

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O0

void __thiscall HvFile::HvFile(HvFile *this,ReadWriter_ptr *r)

{
  ReadWriter_ptr *r_local;
  HvFile *this_local;
  
  std::shared_ptr<ReadWriter>::shared_ptr(&this->_r,r);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->_offsets);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_bootmd5);
  std::vector<HvFile::unkitem,_std::allocator<HvFile::unkitem>_>::vector(&this->_unkitems);
  this->_rootid = 0;
  std::vector<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>::vector
            (&this->_items);
  std::
  map<unsigned_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
  ::map(&this->_roots);
  readheader(this);
  return;
}

Assistant:

HvFile(ReadWriter_ptr r)
        : _r(r), _rootid(0)
    {
        readheader();
    }